

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O2

uoffset_t __thiscall
flatbuffers::FlatBufferBuilder::EndTable
          (FlatBufferBuilder *this,uoffset_t start,voffset_t numfields)

{
  ushort uVar1;
  pointer pFVar2;
  pointer pFVar3;
  size_t sVar4;
  uint8_t *puVar5;
  uint *puVar6;
  uoffset_t uVar7;
  int iVar8;
  undefined6 in_register_00000012;
  pointer pFVar9;
  uint *puVar10;
  uint uVar11;
  ushort *__s2;
  uoffset_t vt_use;
  uint local_5c;
  FlatBufferBuilder *local_58;
  ulong local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  uint8_t *local_40;
  size_t local_38;
  
  uVar7 = PushElement<unsigned_int>(this,0);
  vector_downward::fill
            (&this->buf_,(ulong)(uint)((int)CONCAT62(in_register_00000012,numfields) * 2));
  if (0xffff < uVar7 - start) {
    __assert_fail("table_object_size < 0x10000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                  ,0x199,"uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)")
    ;
  }
  PushElement<unsigned_short>(this,(unsigned_short)(uVar7 - start));
  PushElement<unsigned_short>(this,numfields * 2 + 4);
  __s2 = (ushort *)(this->buf_).cur_;
  pFVar3 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar2 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pFVar9 = pFVar2; pFVar9 != pFVar3; pFVar9 = pFVar9 + 1) {
    if (*(short *)((long)__s2 + (ulong)pFVar9->id) != 0) {
      __assert_fail("!ReadScalar<voffset_t>(buf_.data() + field_location->id)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                    ,0x1a2,
                    "uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)");
    }
    *(short *)((long)__s2 + (ulong)pFVar9->id) = (short)uVar7 - (short)pFVar9->off;
  }
  if (pFVar3 != pFVar2) {
    (this->offsetbuf_).
    super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
  }
  uVar1 = *__s2;
  sVar4 = (this->buf_).reserved_;
  puVar5 = (this->buf_).buf_;
  local_5c = ((int)sVar4 - (int)__s2) + (int)puVar5;
  local_50 = (ulong)local_5c;
  local_48 = &this->vtables_;
  puVar10 = (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar6 = (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = this;
  local_40 = puVar5;
  local_38 = sVar4;
  do {
    if (puVar10 == puVar6) {
      uVar11 = (uint)local_50;
      goto LAB_00112a33;
    }
    uVar11 = *puVar10;
    iVar8 = bcmp(puVar5 + (sVar4 - uVar11),__s2,(ulong)uVar1);
    puVar10 = puVar10 + 1;
  } while (iVar8 != 0);
  __s2 = (ushort *)((long)__s2 + (ulong)((int)local_50 - uVar7));
  (local_58->buf_).cur_ = (uint8_t *)__s2;
  local_5c = uVar11;
LAB_00112a33:
  if (uVar11 == ((int)local_38 + (int)local_40) - (int)__s2) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(local_48,&local_5c);
    local_38 = (local_58->buf_).reserved_;
    local_40 = (local_58->buf_).buf_;
    uVar11 = local_5c;
  }
  *(uint *)(local_40 + (local_38 - uVar7)) = uVar11 - uVar7;
  return uVar7;
}

Assistant:

uoffset_t EndTable(uoffset_t start, voffset_t numfields) {
    // Write the vtable offset, which is the start of any Table.
    // We fill it's value later.
    auto vtableoffsetloc = PushElement<uoffset_t>(0);
    // Write a vtable, which consists entirely of voffset_t elements.
    // It starts with the number of offsets, followed by a type id, followed
    // by the offsets themselves. In reverse:
    buf_.fill(numfields * sizeof(voffset_t));
    auto table_object_size = vtableoffsetloc - start;
    assert(table_object_size < 0x10000);  // Vtable use 16bit offsets.
    PushElement<voffset_t>(table_object_size);
    PushElement<voffset_t>(FieldIndexToOffset(numfields));
    // Write the offsets into the table
    for (auto field_location = offsetbuf_.begin();
              field_location != offsetbuf_.end();
            ++field_location) {
      auto pos = (vtableoffsetloc - field_location->off);
      // If this asserts, it means you've set a field twice.
      assert(!ReadScalar<voffset_t>(buf_.data() + field_location->id));
      WriteScalar<voffset_t>(buf_.data() + field_location->id, pos);
    }
    offsetbuf_.clear();
    auto vt1 = reinterpret_cast<voffset_t *>(buf_.data());
    auto vt1_size = *vt1;
    auto vt_use = GetSize();
    // See if we already have generated a vtable with this exact same
    // layout before. If so, make it point to the old one, remove this one.
    for (auto it = vtables_.begin(); it != vtables_.end(); ++it) {
      if (memcmp(buf_.data_at(*it), vt1, vt1_size)) continue;
      vt_use = *it;
      buf_.pop(GetSize() - vtableoffsetloc);
      break;
    }
    // If this is a new vtable, remember it.
    if (vt_use == GetSize()) {
      vtables_.push_back(vt_use);
    }
    // Fill the vtable offset we created above.
    // The offset points from the beginning of the object to where the
    // vtable is stored.
    // Offsets default direction is downward in memory for future format
    // flexibility (storing all vtables at the start of the file).
    WriteScalar(buf_.data_at(vtableoffsetloc),
                static_cast<soffset_t>(vt_use) -
                  static_cast<soffset_t>(vtableoffsetloc));
    return vtableoffsetloc;
  }